

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_GetFuncInfo(TA_FuncHandle *handle,TA_FuncInfo **funcInfo)

{
  TA_FuncInfo *pTVar1;
  TA_RetCode TVar2;
  
  if (handle == (TA_FuncHandle *)0x0 || funcInfo == (TA_FuncInfo **)0x0) {
    TVar2 = TA_BAD_PARAM;
  }
  else {
    if (*handle == 0xa201b201) {
      pTVar1 = *(TA_FuncInfo **)(handle + 2);
      *funcInfo = pTVar1;
      TVar2 = TA_INVALID_HANDLE;
      if (pTVar1 != (TA_FuncInfo *)0x0) {
        TVar2 = TA_SUCCESS;
      }
      return TVar2;
    }
    TVar2 = TA_INVALID_HANDLE;
  }
  return TVar2;
}

Assistant:

TA_RetCode TA_GetFuncInfo(  const TA_FuncHandle *handle,
                            const TA_FuncInfo **funcInfo )
{
   const TA_FuncDef *funcDef;

   if( !funcInfo || !handle )
   {
      return TA_BAD_PARAM;
   }

   /* Validate that this is a valid funcHandle. */
   funcDef = (const TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      return TA_INVALID_HANDLE;
   }

   *funcInfo = funcDef->funcInfo;  
   if( !funcDef->funcInfo )
      return TA_INVALID_HANDLE;

   return TA_SUCCESS;
}